

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactNSC.h
# Opt level: O1

void __thiscall
chrono::ChContactNSC<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>::
ContIntStateGatherReactions
          (ChContactNSC<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_> *this,
          uint off_L,ChVectorDynamic<> *L)

{
  long lVar1;
  double *pdVar2;
  
  lVar1 = (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if ((long)(ulong)off_L < lVar1) {
    pdVar2 = (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    pdVar2[off_L] = (this->react_force).m_data[0];
    if ((long)(ulong)(off_L + 1) < lVar1) {
      pdVar2[off_L + 1] = (this->react_force).m_data[1];
      if ((long)(ulong)(off_L + 2) < lVar1) {
        pdVar2[off_L + 2] = (this->react_force).m_data[2];
        return;
      }
    }
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
               );
}

Assistant:

virtual void ContIntStateGatherReactions(const unsigned int off_L, ChVectorDynamic<>& L) override {
        L(off_L) = react_force.x();
        L(off_L + 1) = react_force.y();
        L(off_L + 2) = react_force.z();
    }